

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadSequenceBuffer.cc
# Opt level: O0

void __thiscall
ReadSequenceBuffer::ReadSequenceBuffer
          (ReadSequenceBuffer *this,PairedReadsDatastore *_ds,size_t _bufsize,size_t _chunk_size)

{
  int iVar1;
  char *__file;
  void *pvVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = in_RDX;
  in_RDI[5] = in_RCX;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0);
  *(int *)(in_RDI + 7) = iVar1;
  pvVar2 = malloc(in_RDI[4]);
  in_RDI[3] = pvVar2;
  in_RDI[6] = 0xffffffffffffffff;
  return;
}

Assistant:

ReadSequenceBuffer::ReadSequenceBuffer(const PairedReadsDatastore &_ds, size_t _bufsize , size_t _chunk_size):
        paired_datastore(&_ds),bufsize(_bufsize),chunk_size(_chunk_size){
    fd=open(paired_datastore->filename.c_str(),O_RDONLY);
    buffer=(char *)malloc(bufsize);
    buffer_offset=SIZE_MAX;
}